

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov7_pnnx.cpp
# Opt level: O3

void generate_proposals(Mat *anchors,int stride,Mat *in_pad,Mat *feat_blob,float prob_threshold,
                       vector<Object,_std::allocator<Object>_> *objects)

{
  undefined8 uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  size_t sVar5;
  size_t sVar6;
  void *pvVar7;
  undefined1 auVar8 [16];
  long lVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  float *pfVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  float fVar17;
  float extraout_XMM0_Db_01;
  float extraout_XMM0_Db_02;
  float extraout_XMM0_Db_03;
  float extraout_XMM0_Db_04;
  double dVar18;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  undefined1 auVar19 [16];
  double dVar20;
  float fVar21;
  float fVar22;
  float fVar24;
  undefined1 auVar23 [16];
  ulong local_150;
  ulong local_140;
  value_type local_c0;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  float local_78;
  float fStack_74;
  float local_68;
  float fStack_64;
  float local_58;
  float fStack_54;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  uVar2 = anchors->w;
  if (1 < (int)uVar2) {
    uVar3 = in_pad->w;
    local_a8._0_4_ = (undefined4)stride;
    uVar4 = in_pad->h;
    local_a8._4_4_ = local_a8._0_4_;
    local_a8._8_4_ = local_a8._0_4_;
    local_a8._12_4_ = local_a8._0_4_;
    lVar16 = 5;
    local_140 = 0;
    do {
      if (0 < (int)uVar4) {
        lVar10 = local_140 * 0x55;
        uVar1 = *(undefined8 *)((long)anchors->data + local_140 * 8);
        local_98._0_8_ = (undefined8)(float)uVar1;
        local_98._8_8_ = (undefined8)(float)((ulong)uVar1 >> 0x20);
        local_150 = 0;
        do {
          if (0 < (int)uVar3) {
            local_88 = ZEXT416((uint)(float)(int)local_150);
            lVar11 = 0;
            uVar12 = 0;
            do {
              sVar5 = in_pad->elemsize;
              sVar6 = in_pad->cstep;
              lVar9 = (long)in_pad->w * local_150;
              pfVar13 = (float *)((long)in_pad->data + lVar11 + (lVar16 * sVar6 + lVar9) * sVar5);
              uVar14 = 0;
              uVar15 = 0;
              fVar21 = -3.4028235e+38;
              do {
                if (fVar21 < *pfVar13) {
                  uVar15 = uVar14 & 0xffffffff;
                  fVar21 = *pfVar13;
                }
                uVar14 = uVar14 + 1;
                pfVar13 = (float *)((long)pfVar13 + sVar6 * sVar5);
              } while (uVar14 != 0x50);
              fVar17 = expf(-*(float *)((long)in_pad->data +
                                       uVar12 * 4 + sVar6 * (lVar10 + 4) * sVar5 + lVar9 * sVar5));
              fVar21 = expf(-fVar21);
              auVar19._4_4_ = fVar21 + DAT_005a40f0._4_4_;
              auVar19._0_4_ = fVar17 + (float)DAT_005a40f0;
              auVar19._8_4_ = extraout_XMM0_Db + DAT_005a40f0._8_4_;
              auVar19._12_4_ = extraout_XMM0_Db_00 + DAT_005a40f0._12_4_;
              auVar19 = divps(_DAT_005a40f0,auVar19);
              fVar21 = auVar19._4_4_;
              fVar17 = fVar21 * auVar19._0_4_;
              if (0.25 <= fVar17) {
                sVar5 = in_pad->cstep;
                pvVar7 = in_pad->data;
                sVar6 = in_pad->elemsize;
                local_48 = fVar17;
                fStack_44 = fVar21;
                fStack_40 = fVar21;
                fStack_3c = fVar21;
                local_58 = expf(-*(float *)((long)pvVar7 +
                                           uVar12 * 4 +
                                           (long)in_pad->w * local_150 * sVar6 +
                                           sVar5 * lVar10 * sVar6));
                fStack_54 = extraout_XMM0_Db_01;
                local_68 = expf(-*(float *)((long)pvVar7 +
                                           uVar12 * 4 +
                                           (long)in_pad->w * local_150 * sVar6 +
                                           sVar5 * (lVar10 + 1) * sVar6));
                fStack_64 = extraout_XMM0_Db_02;
                local_78 = expf(-*(float *)((long)pvVar7 +
                                           uVar12 * 4 +
                                           (long)in_pad->w * local_150 * sVar6 +
                                           sVar5 * (lVar10 + 2) * sVar6));
                fStack_74 = extraout_XMM0_Db_03;
                fVar21 = expf(-*(float *)((long)pvVar7 +
                                         uVar12 * 4 +
                                         (long)in_pad->w * local_150 * sVar6 +
                                         sVar5 * (lVar10 + 3) * sVar6));
                auVar23._4_4_ = local_68 + DAT_005a40f0._4_4_;
                auVar23._0_4_ = local_58 + (float)DAT_005a40f0;
                auVar23._8_4_ = fStack_54 + DAT_005a40f0._8_4_;
                auVar23._12_4_ = fStack_64 + DAT_005a40f0._12_4_;
                auVar23 = divps(_DAT_005a40f0,auVar23);
                auVar8._4_4_ = fVar21 + DAT_005a40f0._4_4_;
                auVar8._0_4_ = local_78 + (float)DAT_005a40f0;
                auVar8._8_4_ = fStack_74 + DAT_005a40f0._8_4_;
                auVar8._12_4_ = extraout_XMM0_Db_04 + DAT_005a40f0._12_4_;
                auVar19 = divps(_DAT_005a40f0,auVar8);
                fVar22 = (auVar23._0_4_ + auVar23._0_4_ + -0.5 + (float)(int)uVar12) *
                         (float)local_a8._0_4_;
                fVar24 = (auVar23._4_4_ + auVar23._4_4_ + -0.5 + (float)local_88._0_4_) *
                         (float)local_a8._4_4_;
                dVar18 = (double)(auVar19._0_4_ + auVar19._0_4_);
                dVar20 = (double)(auVar19._4_4_ + auVar19._4_4_);
                fVar21 = (float)(dVar18 * dVar18 * (double)local_98._0_8_) * 0.5;
                fVar17 = (float)(dVar20 * dVar20 * (double)local_98._8_8_) * 0.5;
                local_c0.rect.x = fVar22 - fVar21;
                local_c0.rect.y = fVar24 - fVar17;
                local_c0.rect.width = (fVar21 + fVar22) - local_c0.rect.x;
                local_c0.rect.height = (fVar17 + fVar24) - local_c0.rect.y;
                local_c0.label = (int)uVar15;
                local_c0.prob = local_48;
                std::vector<Object,_std::allocator<Object>_>::push_back
                          ((vector<Object,_std::allocator<Object>_> *)feat_blob,&local_c0);
              }
              uVar12 = uVar12 + 1;
              lVar11 = lVar11 + 4;
            } while (uVar12 != uVar3);
          }
          local_150 = local_150 + 1;
        } while (local_150 != uVar4);
      }
      local_140 = local_140 + 1;
      lVar16 = lVar16 + 0x55;
    } while (local_140 != uVar2 >> 1);
  }
  return;
}

Assistant:

static void generate_proposals(const ncnn::Mat& anchors, int stride, const ncnn::Mat& in_pad, const ncnn::Mat& feat_blob, float prob_threshold, std::vector<Object>& objects)
{
    const int num_grid_x = feat_blob.w;
    const int num_grid_y = feat_blob.h;

    const int num_anchors = anchors.w / 2;

    const int num_class = 80;

    for (int q = 0; q < num_anchors; q++)
    {
        const float anchor_w = anchors[q * 2];
        const float anchor_h = anchors[q * 2 + 1];

        for (int i = 0; i < num_grid_y; i++)
        {
            for (int j = 0; j < num_grid_x; j++)
            {
                // find class index with max class score
                int class_index = 0;
                float class_score = -FLT_MAX;
                for (int k = 0; k < num_class; k++)
                {
                    float score = feat_blob.channel(q * 85 + 5 + k).row(i)[j];
                    if (score > class_score)
                    {
                        class_index = k;
                        class_score = score;
                    }
                }

                float box_score = feat_blob.channel(q * 85 + 4).row(i)[j];

                float confidence = sigmoid(box_score) * sigmoid(class_score);

                if (confidence >= prob_threshold)
                {
                    // yolov5/models/yolo.py Detect forward
                    // y = x[i].sigmoid()
                    // y[..., 0:2] = (y[..., 0:2] * 2. - 0.5 + self.grid[i].to(x[i].device)) * self.stride[i]  # xy
                    // y[..., 2:4] = (y[..., 2:4] * 2) ** 2 * self.anchor_grid[i]  # wh

                    float dx = sigmoid(feat_blob.channel(q * 85 + 0).row(i)[j]);
                    float dy = sigmoid(feat_blob.channel(q * 85 + 1).row(i)[j]);
                    float dw = sigmoid(feat_blob.channel(q * 85 + 2).row(i)[j]);
                    float dh = sigmoid(feat_blob.channel(q * 85 + 3).row(i)[j]);

                    float pb_cx = (dx * 2.f - 0.5f + j) * stride;
                    float pb_cy = (dy * 2.f - 0.5f + i) * stride;

                    float pb_w = pow(dw * 2.f, 2) * anchor_w;
                    float pb_h = pow(dh * 2.f, 2) * anchor_h;

                    float x0 = pb_cx - pb_w * 0.5f;
                    float y0 = pb_cy - pb_h * 0.5f;
                    float x1 = pb_cx + pb_w * 0.5f;
                    float y1 = pb_cy + pb_h * 0.5f;

                    Object obj;
                    obj.rect.x = x0;
                    obj.rect.y = y0;
                    obj.rect.width = x1 - x0;
                    obj.rect.height = y1 - y0;
                    obj.label = class_index;
                    obj.prob = confidence;

                    objects.push_back(obj);
                }
            }
        }
    }
}